

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

int skip_nearest_near_mv_using_refmv_weight
              (MACROBLOCK *x,PREDICTION_MODE this_mode,int8_t ref_frame_type,
              PREDICTION_MODE best_mode)

{
  int iVar1;
  ushort *puVar2;
  PREDICTION_MODE in_CL;
  char in_DL;
  char in_SIL;
  long in_RDI;
  int prune_thresh;
  int ref_mv_idx;
  int nearest_refmv_count;
  int ref_mv_count;
  uint16_t *ref_mv_weight;
  MB_MODE_INFO_EXT *mbmi_ext;
  MACROBLOCKD *xd;
  uint local_44;
  int local_3c;
  int local_38;
  int local_4;
  
  if ((in_SIL == '\r') || (in_SIL == '\x0e')) {
    iVar1 = is_inter_mode(in_CL);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else if (((*(byte *)(in_RDI + 0x2061) & 1) == 0) || ((*(byte *)(in_RDI + 0x2060) & 1) == 0)) {
      local_4 = 0;
    }
    else {
      puVar2 = (ushort *)(in_RDI + 0x4010 + (long)in_DL * 8);
      if (*(byte *)(in_RDI + 0x40f8 + (long)in_DL) < 4) {
        local_44 = (uint)*(byte *)(in_RDI + 0x40f8 + (long)in_DL);
      }
      else {
        local_44 = 3;
      }
      if (local_44 == 0) {
        local_4 = 0;
      }
      else if ((in_SIL == '\r') && (0x27f < *puVar2)) {
        local_4 = 0;
      }
      else {
        local_38 = 0;
        for (local_3c = 0; local_3c < (int)local_44; local_3c = local_3c + 1) {
          if (0x27f < puVar2[local_3c]) {
            local_38 = local_38 + 1;
          }
        }
        if (local_38 < (int)((1 < local_44) + 1)) {
          local_4 = 1;
        }
        else {
          local_4 = 0;
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int skip_nearest_near_mv_using_refmv_weight(
    const MACROBLOCK *const x, const PREDICTION_MODE this_mode,
    const int8_t ref_frame_type, PREDICTION_MODE best_mode) {
  if (this_mode != NEARESTMV && this_mode != NEARMV) return 0;
  // Do not skip the mode if the current block has not yet obtained a valid
  // inter mode.
  if (!is_inter_mode(best_mode)) return 0;

  const MACROBLOCKD *xd = &x->e_mbd;
  // Do not skip the mode if both the top and left neighboring blocks are not
  // available.
  if (!xd->left_available || !xd->up_available) return 0;
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const uint16_t *const ref_mv_weight = mbmi_ext->weight[ref_frame_type];
  const int ref_mv_count =
      AOMMIN(MAX_REF_MV_SEARCH, mbmi_ext->ref_mv_count[ref_frame_type]);

  if (ref_mv_count == 0) return 0;
  // If ref mv list has at least one nearest candidate do not prune NEARESTMV
  if (this_mode == NEARESTMV && ref_mv_weight[0] >= REF_CAT_LEVEL) return 0;

  // Count number of ref mvs populated from nearest candidates
  int nearest_refmv_count = 0;
  for (int ref_mv_idx = 0; ref_mv_idx < ref_mv_count; ref_mv_idx++) {
    if (ref_mv_weight[ref_mv_idx] >= REF_CAT_LEVEL) nearest_refmv_count++;
  }

  // nearest_refmv_count indicates the closeness of block motion characteristics
  // with respect to its spatial neighbor. Smaller value of nearest_refmv_count
  // w.r.t to ref_mv_count means less correlation with its spatial neighbors.
  // Hence less possibility for NEARESTMV and NEARMV modes becoming the best
  // mode since these modes work well for blocks that shares similar motion
  // characteristics with its neighbor. Thus, NEARMV mode is pruned when
  // nearest_refmv_count is relatively smaller than ref_mv_count and NEARESTMV
  // mode is pruned if none of the ref mvs are populated from nearest candidate.
  const int prune_thresh = 1 + (ref_mv_count >= 2);
  if (nearest_refmv_count < prune_thresh) return 1;
  return 0;
}